

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomNative.cpp
# Opt level: O2

PackageInfo * chatra::emb::random::packageInfo(void)

{
  PackageInfo *in_RDI;
  long lVar1;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  NativeCallHandlerInfo local_238 [3];
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  
  std::__cxx11::string::string
            ((string *)&local_100,"random",
             (allocator *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string
            ((string *)&local_e0,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\ndef _native_comply(first, last, value) as native\ndef _native_convert(first, last, value) as native\ndef _native_systemRandom() as native\n\nclass RandomGenerator\n\tdef init()\n\t\treturn\n\n\tdef nextU64()\n\t\tthrow UnsupportedOperationException()\n\n\tdef nextInt(first: Int, last: Int)\n\t\tif first >= last\n\t\t\tthrow IllegalArgumentException()\n\t\tvalue: 0\n\t\twhile true\n\t\t\tvalue = nextU64()\n\t\t\tif _native_comply(first, last, value)\n\t\t\t\tbreak\n\t\treturn _native_convert(first, last, value)\n\n\tdef nextInt(last: Int)\n\t\treturn nextInt(0, last)\n\n\tdef nextFloat()\n\t\treturn Float(nextU64() >>> 11) * (1.0 / 9007199254740992.0)\n\n\n// The SFMT implementation based on original C implementation of\n// SIMD-oriented Fast Mersenne Twister (SFMT)\n// see http://www.math.sci.hiroshima-u.ac.jp/~m-mat/MT/SFMT/index-jp.html\n\nvar SFMT_MEXP: 19937\n\nvar SFMT_POS1: 122\nvar SFMT_SL1: 18\nvar SFMT_SL2: 1\nvar SFMT_SR1: 11\nvar SFMT_SR2: 1\nvar SFMT_MSK1: 0xdfffffef\nvar SFMT_MSK2: 0xddfecb7f\nvar SFMT_MSK3: 0xbffaffff\nvar SFMT_MSK4: 0xbffffff6\nvar SFMT_PARITY1: 0x00000001\nvar SFMT_PARITY2: 0x00000000\nvar SFMT_PARITY3: 0x00000000\nvar SFMT_PARITY4: 0x13c9e684\n\nvar SFMT_N: SFMT_MEXP / 128 + 1\nvar SFMT_N32: SFMT_N * 4\n\nclass SfmtW128\n\tvar u: {0, 0, 0, 0}\n\nclass Sfmt extends RandomGenerator\n\tvar state: {for in Range(SFMT_N): SfmtW128()}\n\tvar idx: 0\n\n\tdef rshift128(o..." /* TRUNCATED STRING LITERAL */
             ,(allocator *)
              ((long)&handlers.
                      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  Script::Script((Script *)local_238,&local_100,&local_e0);
  __l._M_len = 1;
  __l._M_array = (iterator)local_238;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_60,__l,
             (allocator_type *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Script::~Script((Script *)local_238);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string
            ((string *)&local_c0,"_native_comply",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_238,comply,&local_c0);
  std::__cxx11::string::string
            ((string *)&local_a0,"_native_convert",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_238 + 1,convert,&local_a0);
  std::__cxx11::string::string
            ((string *)&local_80,"_native_systemRandom",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_238 + 2,systemRandom,&local_80);
  __l_00._M_len = 3;
  __l_00._M_array = local_238;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,
             (allocator_type *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  lVar1 = 0xd0;
  do {
    NativeCallHandlerInfo::~NativeCallHandlerInfo
              ((NativeCallHandlerInfo *)((long)&local_238[0].handler + lVar1));
    lVar1 = lVar1 + -0x68;
  } while (lVar1 != -0x68);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_60);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_60);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"random", script}};
	std::vector<HandlerInfo> handlers = {
			{comply, "_native_comply"},
			{convert, "_native_convert"},
			{systemRandom, "_native_systemRandom"},
	};
	return {scripts, handlers, nullptr};
}